

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O2

bool __thiscall tinyusdz::ascii::AsciiParser::ParseMatrix(AsciiParser *this,matrix4f *result)

{
  bool bVar1;
  long lVar2;
  vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_> content;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  bVar1 = Expect(this,'(');
  if (!bVar1) {
    return false;
  }
  content.super__Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  content.super__Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  content.super__Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar1 = SepBy1TupleType<float,4ul>(this,',',&content);
  if (bVar1) {
    if ((long)content.
              super__Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)content.
              super__Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>.
              _M_impl.super__Vector_impl_data._M_start == 0x40) {
      bVar1 = Expect(this,')');
      if (bVar1) {
        for (lVar2 = 0; lVar2 != 0x40; lVar2 = lVar2 + 0x10) {
          *(undefined4 *)((long)result->m[0] + lVar2) =
               *(undefined4 *)
                ((long)(content.
                        super__Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar2);
          *(undefined4 *)((long)result->m[0] + lVar2 + 4) =
               *(undefined4 *)
                ((long)(content.
                        super__Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar2 + 4);
          *(undefined4 *)((long)result->m[0] + lVar2 + 8) =
               *(undefined4 *)
                ((long)(content.
                        super__Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar2 + 8);
          *(undefined4 *)((long)result->m[0] + lVar2 + 0xc) =
               *(undefined4 *)
                ((long)(content.
                        super__Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar2 + 0xc);
        }
        bVar1 = true;
        goto LAB_002e33d6;
      }
    }
    else {
      std::__cxx11::to_string
                (&local_80,
                 (long)content.
                       super__Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)content.
                       super__Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 4);
      ::std::operator+(&local_60,"# of rows in matrix4f must be 4, but got ",&local_80);
      ::std::operator+(&local_40,&local_60,"\n");
      PushError(this,(string *)&local_40);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
    }
  }
  bVar1 = false;
LAB_002e33d6:
  ::std::_Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>::
  ~_Vector_base(&content.
                 super__Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
               );
  return bVar1;
}

Assistant:

bool AsciiParser::ParseMatrix(value::matrix4f *result) {

  if (!Expect('(')) {
    return false;
  }

  std::vector<std::array<float, 4>> content;
  if (!SepBy1TupleType<float, 4>(',', &content)) {
    return false;
  }

  if (content.size() != 4) {
    PushError("# of rows in matrix4f must be 4, but got " +
              std::to_string(content.size()) + "\n");
    return false;
  }

  if (!Expect(')')) {
    return false;
  }

  for (size_t i = 0; i < 4; i++) {
    result->m[i][0] = content[i][0];
    result->m[i][1] = content[i][1];
    result->m[i][2] = content[i][2];
    result->m[i][3] = content[i][3];
  }

  return true;
}